

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gssc.c
# Opt level: O0

Ssh_gss_stat ssh_gssapi_release_cred(ssh_gss_library *lib,Ssh_gss_ctx *ctx)

{
  OM_uint32 local_38;
  OM_uint32 local_34;
  OM_uint32 maj_stat;
  OM_uint32 min_stat;
  gssapi_ssh_gss_ctx *gssctx;
  gssapi_functions *gss;
  Ssh_gss_ctx *ctx_local;
  ssh_gss_library *lib_local;
  
  gssctx = (gssapi_ssh_gss_ctx *)&lib->u;
  _maj_stat = *ctx;
  local_38 = 0;
  if (_maj_stat == (Ssh_gss_ctx)0x0) {
    lib_local._4_4_ = SSH_GSS_FAILURE;
  }
  else {
    gss = (gssapi_functions *)ctx;
    ctx_local = (Ssh_gss_ctx *)lib;
    if (*(long *)((long)_maj_stat + 8) != 0) {
      local_38 = (*((gssapi_functions *)gssctx)->delete_sec_context)
                           (&local_34,(gss_ctx_id_t *)((long)_maj_stat + 8),(gss_buffer_t)0x0);
    }
    safefree(_maj_stat);
    gss->delete_sec_context = (t_gss_delete_sec_context)0x0;
    if (local_38 == 0) {
      lib_local._4_4_ = SSH_GSS_OK;
    }
    else {
      lib_local._4_4_ = SSH_GSS_FAILURE;
    }
  }
  return lib_local._4_4_;
}

Assistant:

static Ssh_gss_stat ssh_gssapi_release_cred(struct ssh_gss_library *lib,
                                            Ssh_gss_ctx *ctx)
{
    struct gssapi_functions *gss = &lib->u.gssapi;
    gssapi_ssh_gss_ctx *gssctx = (gssapi_ssh_gss_ctx *) *ctx;
    OM_uint32 min_stat;
    OM_uint32 maj_stat=GSS_S_COMPLETE;

    if (gssctx == NULL) return SSH_GSS_FAILURE;
    if (gssctx->ctx != GSS_C_NO_CONTEXT)
        maj_stat = gss->delete_sec_context(&min_stat,&gssctx->ctx,GSS_C_NO_BUFFER);
    sfree(gssctx);
    *ctx = NULL;

    if (maj_stat == GSS_S_COMPLETE) return SSH_GSS_OK;
    return SSH_GSS_FAILURE;
}